

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcCrossProductsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          double *categoryRates,float *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  pointer pfVar1;
  double *pdVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  pointer pfVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  double *pdVar19;
  float *pfVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  int j;
  ulong uVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  vector<float,_std::allocator<float>_> tmp;
  allocator_type local_85;
  value_type_conflict3 local_84;
  float *local_80;
  BeagleCPUImpl<float,_1,_0> *local_78;
  double local_70;
  float *local_68;
  double *local_60;
  long local_58;
  double *local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  if (0 < this->kPatternCount) {
    lVar26 = 0;
    lVar25 = 0;
    local_80 = preOrderPartial;
    local_78 = this;
    local_70 = edgeLength;
    local_68 = postOrderPartial;
    local_60 = outCrossProducts;
    local_50 = categoryRates;
    do {
      local_84 = 0.0;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_48,(ulong)(uint)(this->kStateCount * this->kStateCount),&local_84,&local_85)
      ;
      iVar4 = this->kCategoryCount;
      if ((long)iVar4 < 1) {
        dVar35 = 0.0;
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      }
      else {
        iVar5 = this->kPatternCount;
        lVar16 = (long)this->kPartialsPaddedStateCount;
        uVar6 = this->kStateCount;
        uVar22 = (ulong)uVar6;
        pfVar20 = (float *)((long)local_68 + lVar26 * lVar16);
        lVar21 = iVar5 * lVar16;
        pfVar18 = (float *)(lVar26 * lVar16 + (long)local_80);
        auVar34 = ZEXT816(0) << 0x40;
        lVar23 = 0;
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar33 = ZEXT816(0) << 0x40;
          if (0 < (int)uVar6) {
            uVar17 = 0;
            do {
              auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)pfVar20[uVar17]),
                                        ZEXT416((uint)pfVar18[uVar17]));
              uVar17 = uVar17 + 1;
            } while (uVar22 != uVar17);
          }
          fVar3 = categoryWeights[lVar23];
          if (0 < (int)uVar6) {
            auVar36._0_4_ = (float)((double)(float)local_50[lVar23] * local_70);
            auVar36._4_4_ = (int)((ulong)((double)(float)local_50[lVar23] * local_70) >> 0x20);
            auVar36._8_8_ = 0;
            uVar17 = 0;
            pfVar15 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              uVar24 = 0;
              do {
                auVar14 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * local_80[(lVar23 * iVar5 + lVar25)
                                                                          * lVar16 + uVar17] *
                                                                 pfVar20[uVar24])),auVar36,
                                          ZEXT416((uint)pfVar15[uVar24]));
                pfVar15[uVar24] = auVar14._0_4_;
                uVar24 = uVar24 + 1;
              } while (uVar22 != uVar24);
              uVar17 = uVar17 + 1;
              pfVar15 = pfVar15 + (int)uVar6;
            } while (uVar17 != uVar22);
          }
          auVar34 = vfmadd231ss_fma(auVar34,auVar33,ZEXT416((uint)fVar3));
          lVar23 = lVar23 + 1;
          pfVar20 = pfVar20 + lVar21;
          pfVar18 = pfVar18 + lVar21;
        } while (lVar23 != iVar4);
        dVar35 = (double)auVar34._0_4_;
        this = local_78;
        local_58 = lVar26;
      }
      iVar4 = this->kStateCount;
      lVar16 = (long)iVar4;
      if (0 < lVar16) {
        auVar34._0_8_ = this->gPatternWeights[lVar25] / dVar35;
        auVar34._8_8_ = 0;
        auVar29 = vpbroadcastq_avx512f();
        auVar30 = vbroadcastsd_avx512f(auVar34);
        lVar21 = 0;
        pfVar15 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar19 = local_60;
        do {
          uVar22 = 0;
          do {
            auVar31 = vpbroadcastq_avx512f();
            auVar31 = vporq_avx512f(auVar31,auVar28);
            uVar17 = vpcmpuq_avx512f(auVar31,auVar29,2);
            pfVar1 = pfVar15 + uVar22;
            bVar7 = (byte)uVar17;
            auVar27._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * (int)pfVar1[1];
            auVar27._0_4_ = (uint)(bVar7 & 1) * (int)*pfVar1;
            auVar27._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * (int)pfVar1[2];
            auVar27._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * (int)pfVar1[3];
            auVar27._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * (int)pfVar1[4];
            auVar27._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * (int)pfVar1[5];
            auVar27._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * (int)pfVar1[6];
            auVar27._28_4_ = (uint)(byte)(uVar17 >> 7) * (int)pfVar1[7];
            auVar31 = vcvtps2pd_avx512f(auVar27);
            pdVar2 = pdVar19 + uVar22;
            auVar32._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * (long)pdVar2[1];
            auVar32._0_8_ = (ulong)(bVar7 & 1) * (long)*pdVar2;
            auVar32._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * (long)pdVar2[2];
            auVar32._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * (long)pdVar2[3];
            auVar32._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * (long)pdVar2[4];
            auVar32._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * (long)pdVar2[5];
            auVar32._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * (long)pdVar2[6];
            auVar32._56_8_ = (uVar17 >> 7) * (long)pdVar2[7];
            auVar31 = vfmadd231pd_avx512f(auVar32,auVar30,auVar31);
            pdVar2 = pdVar19 + uVar22;
            bVar8 = (bool)((byte)(uVar17 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar17 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar17 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar17 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar17 >> 6) & 1);
            *pdVar2 = (double)((ulong)(bVar7 & 1) * auVar31._0_8_ |
                              (ulong)!(bool)(bVar7 & 1) * (long)*pdVar2);
            pdVar2[1] = (double)((ulong)bVar8 * auVar31._8_8_ | (ulong)!bVar8 * (long)pdVar2[1]);
            pdVar2[2] = (double)((ulong)bVar9 * auVar31._16_8_ | (ulong)!bVar9 * (long)pdVar2[2]);
            pdVar2[3] = (double)((ulong)bVar10 * auVar31._24_8_ | (ulong)!bVar10 * (long)pdVar2[3]);
            pdVar2[4] = (double)((ulong)bVar11 * auVar31._32_8_ | (ulong)!bVar11 * (long)pdVar2[4]);
            pdVar2[5] = (double)((ulong)bVar12 * auVar31._40_8_ | (ulong)!bVar12 * (long)pdVar2[5]);
            pdVar2[6] = (double)((ulong)bVar13 * auVar31._48_8_ | (ulong)!bVar13 * (long)pdVar2[6]);
            pdVar2[7] = (double)((uVar17 >> 7) * auVar31._56_8_ |
                                (ulong)!SUB81(uVar17 >> 7,0) * (long)pdVar2[7]);
            uVar22 = uVar22 + 8;
          } while ((iVar4 + 7U & 0xfffffff8) != uVar22);
          lVar21 = lVar21 + 1;
          pdVar19 = pdVar19 + lVar16;
          pfVar15 = pfVar15 + lVar16;
        } while (lVar21 != lVar16);
      }
      if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar25 = lVar25 + 1;
      lVar26 = lVar26 + 4;
    } while (lVar25 < this->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                  const REALTYPE *preOrderPartial,
                                                                  const double *categoryRates,
                                                                  const REALTYPE *categoryWeights,
                                                                  const double edgeLength,
                                                                  double *outCrossProducts,
                                                                  double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE denominator = 0.0;
            for (int k = 0; k < kStateCount; k++) {
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }
            patternDenominator += denominator * weight;

            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    tmp[k * kStateCount + j] += preOrderPartial[v + k] * postOrderPartial[v + j] * weight * scale;
                }
            }
        }

        const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < kStateCount; k++) {
            for (int j = 0; j < kStateCount; j++) {
                outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
            }
        }
    }
}